

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svggeometryelement.cpp
# Opt level: O2

void __thiscall lunasvg::SVGLineElement::SVGLineElement(SVGLineElement *this,Document *document)

{
  SVGGeometryElement::SVGGeometryElement(&this->super_SVGGeometryElement,document,Line);
  (this->super_SVGGeometryElement).super_SVGGraphicsElement.super_SVGElement.super_SVGNode.
  _vptr_SVGNode = (_func_int **)&PTR__SVGLineElement_001544c0;
  SVGLength::SVGLength(&this->m_x1,X1,Horizontal,Allow,0.0,None);
  SVGLength::SVGLength(&this->m_y1,Y1,Vertical,Allow,0.0,None);
  SVGLength::SVGLength(&this->m_x2,X2,Horizontal,Allow,0.0,None);
  SVGLength::SVGLength(&this->m_y2,Y2,Vertical,Allow,0.0,None);
  SVGElement::addProperty((SVGElement *)this,&(this->m_x1).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_y1).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_x2).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_y2).super_SVGProperty);
  return;
}

Assistant:

SVGLineElement::SVGLineElement(Document* document)
    : SVGGeometryElement(document, ElementID::Line)
    , m_x1(PropertyID::X1, LengthDirection::Horizontal, LengthNegativeMode::Allow)
    , m_y1(PropertyID::Y1, LengthDirection::Vertical, LengthNegativeMode::Allow)
    , m_x2(PropertyID::X2, LengthDirection::Horizontal, LengthNegativeMode::Allow)
    , m_y2(PropertyID::Y2, LengthDirection::Vertical, LengthNegativeMode::Allow)
{
    addProperty(m_x1);
    addProperty(m_y1);
    addProperty(m_x2);
    addProperty(m_y2);
}